

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

bool cmState::IsCacheEntryType(string *key)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  string *key_local;
  
  __first = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
            ::begin(&cmCacheEntryTypes_abi_cxx11_);
  __last = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
           ::end(&cmCacheEntryTypes_abi_cxx11_);
  bVar1 = std::
          any_of<std::__cxx11::string_const*,cmState::IsCacheEntryType(std::__cxx11::string_const&)::__0>
                    (__first,__last,(anon_class_8_1_ba1d59bf_for__M_pred)key);
  return bVar1;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  return std::any_of(
    cmCacheEntryTypes.begin(), cmCacheEntryTypes.end(),
    [&key](std::string const& i) -> bool { return key == i; });
}